

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.cpp
# Opt level: O2

Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> * __thiscall
Kernel::RenderMonom::operator()
          (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *__return_storage_ptr__,
          RenderMonom *this,PreMonom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *x)

{
  _Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false> _Var1;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar2;
  bool bVar3;
  PolyNf *x_1;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *other;
  IntegerConstantType local_108;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_f8;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_cc;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  local_b0;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_a0;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  local_80;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_68;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_4c;
  
  _Var1._M_head_impl =
       (x->factors)._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<Kernel::PolyNf>,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<Kernel::PolyNf>_*,_std::default_delete<Lib::Stack<Kernel::PolyNf>_>_>
       .super__Head_base<0UL,_Lib::Stack<Kernel::PolyNf>_*,_false>._M_head_impl;
  Lib::Stack<Kernel::PolyNf>::sort<std::less<Kernel::PolyNf>>(_Var1._M_head_impl);
  local_f8._cursor = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_f8._end = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  local_f8._capacity = 0;
  local_f8._stack = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  if ((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
       *)(_Var1._M_head_impl)->_cursor !=
      (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
       *)(_Var1._M_head_impl)->_stack) {
    Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
    ::DefaultImpl(&local_80,
                  (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                   *)(_Var1._M_head_impl)->_stack);
    Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
    ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                   *)&local_cc,&local_80);
    local_cc.power = 0;
    pDVar2 = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
              *)(_Var1._M_head_impl)->_cursor;
    for (other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                  *)(_Var1._M_head_impl)->_stack; other != pDVar2; other = other + 1) {
      bVar3 = Kernel::operator==((PolyNf *)other,&local_cc.term);
      if (bVar3) {
        local_cc.power = local_cc.power + 1;
      }
      else {
        MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
                  (&local_4c,&local_cc);
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::push
                  (&local_f8,&local_4c);
        Lib::CoproductImpl::TrivialOperations::CopyCons::
        DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
        ::operator=((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                     *)&local_cc,other);
        local_cc.power = 1;
      }
    }
    MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor(&local_68,&local_cc);
    Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::push
              (&local_f8,&local_68);
  }
  IntegerConstantType::IntegerConstantType(&local_108,&x->numeral);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack
            (&local_a0,&local_f8);
  Lib::
  perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>
            ((Lib *)&local_b0,
             (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)&local_a0);
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Monom
            (__return_storage_ptr__,&local_108,&local_b0);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
            (&local_a0);
  IntegerConstantType::~IntegerConstantType(&local_108);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::~Stack
            (&local_f8);
  return __return_storage_ptr__;
}

Assistant:

Monom<NumTraits> operator()(PreMonom<NumTraits>&& x) const
  {
    using Monom        = Monom       <NumTraits>;

    auto& factors = *x.factors;
    factors.sort();

    Stack<MonomFactor<NumTraits>> out;

    if (factors.size() > 0) {
      auto cur = MonomFactor<NumTraits>(factors[0], 0);
      for (auto& x : factors) {
        if (x == cur.term) {
          cur.power++;
        } else {
          out.push(cur);
          cur.term = x;
          cur.power = 1;
        }
      }
      out.push(cur);
    }
    return Monom(std::move(x.numeral), perfect(MonomFactors<NumTraits>(std::move(out))));
  }